

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void kurtosis_double_suite::test_same(void)

{
  double dVar1;
  anon_struct_8_1_6167ffdf_for_sum aVar2;
  double dVar3;
  moment_kurtosis<double> filter;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  basic_moment<double,_(trial::online::with)4> local_90;
  
  local_90.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.mean_factor = 0.125;
  local_90.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.normalization = 0.0;
  local_90.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.sum.mean = 0.0;
  local_90.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.var_factor = 0.25;
  local_90.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.normalization = 0.0;
  local_90.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum.variance = 0.0;
  local_90.super_basic_moment<double,_(trial::online::with)3>.skewness_factor = 0.25;
  local_90.super_basic_moment<double,_(trial::online::with)3>.normalization = 0.0;
  local_90.super_basic_moment<double,_(trial::online::with)3>.sum.skewness = 0.0;
  local_90.kurtosis_factor = 0.25;
  local_90.sum.kurtosis = 0.0;
  local_90.normalization = 0.0;
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&local_90,1.0);
  local_b8 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            local_90.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x294,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  local_b8 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            local_90.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x295,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  dVar1 = 0.0;
  if (0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.normalization) {
    dVar3 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                    super_basic_moment<double,_(trial::online::with)2>.normalization
                             ) &
                    (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                           local_90.super_basic_moment<double,_(trial::online::with)3>.
                           super_basic_moment<double,_(trial::online::with)2>.normalization));
    if (2.220446049250313e-16 < dVar3) {
      if (dVar3 < 0.0) {
        local_b0 = local_90.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
        uStack_a0 = 0;
        local_a8 = dVar3;
        dVar1 = sqrt(dVar3);
        aVar2.skewness = local_b0;
        dVar3 = local_a8;
      }
      else {
        dVar1 = SQRT(dVar3);
        aVar2.skewness = local_90.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      }
      dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
              local_90.super_basic_moment<double,_(trial::online::with)3>.normalization;
    }
  }
  local_c0 = 0;
  local_b8 = dVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x296,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  local_b8 = 0.0;
  if ((0.0 < local_90.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             local_90.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (local_90.sum.kurtosis / (dVar1 * dVar1)) / local_90.normalization;
  }
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x297,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&local_90,1.0);
  local_b8 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            local_90.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x299,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  local_b8 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            local_90.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29a,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  dVar1 = 0.0;
  if (0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.normalization) {
    dVar3 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                    super_basic_moment<double,_(trial::online::with)2>.normalization
                             ) &
                    (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                           local_90.super_basic_moment<double,_(trial::online::with)3>.
                           super_basic_moment<double,_(trial::online::with)2>.normalization));
    if (2.220446049250313e-16 < dVar3) {
      if (dVar3 < 0.0) {
        local_b0 = local_90.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
        uStack_a0 = 0;
        local_a8 = dVar3;
        dVar1 = sqrt(dVar3);
        aVar2.skewness = local_b0;
        dVar3 = local_a8;
      }
      else {
        dVar1 = SQRT(dVar3);
        aVar2.skewness = local_90.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      }
      dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
              local_90.super_basic_moment<double,_(trial::online::with)3>.normalization;
    }
  }
  local_c0 = 0;
  local_b8 = dVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29b,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  local_b8 = 0.0;
  if ((0.0 < local_90.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             local_90.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (local_90.sum.kurtosis / (dVar1 * dVar1)) / local_90.normalization;
  }
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29c,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&local_90,1.0);
  local_b8 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            local_90.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29e,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  local_b8 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            local_90.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29f,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  dVar1 = 0.0;
  if (0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.normalization) {
    dVar3 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                    super_basic_moment<double,_(trial::online::with)2>.normalization
                             ) &
                    (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                           local_90.super_basic_moment<double,_(trial::online::with)3>.
                           super_basic_moment<double,_(trial::online::with)2>.normalization));
    if (2.220446049250313e-16 < dVar3) {
      if (dVar3 < 0.0) {
        local_b0 = local_90.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
        uStack_a0 = 0;
        local_a8 = dVar3;
        dVar1 = sqrt(dVar3);
        aVar2.skewness = local_b0;
        dVar3 = local_a8;
      }
      else {
        dVar1 = SQRT(dVar3);
        aVar2.skewness = local_90.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      }
      dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
              local_90.super_basic_moment<double,_(trial::online::with)3>.normalization;
    }
  }
  local_c0 = 0;
  local_b8 = dVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2a0,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  local_b8 = 0.0;
  if ((0.0 < local_90.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             local_90.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (local_90.sum.kurtosis / (dVar1 * dVar1)) / local_90.normalization;
  }
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2a1,"void kurtosis_double_suite::test_same()",&local_b8,&local_c0);
  return;
}

Assistant:

void test_same()
{
    decay::moment_kurtosis<double> filter(one_over_eight, one_over_four, one_over_four, one_over_four);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
}